

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node *
lyd_create_anydata(lyd_node *parent,lys_node *schema,void *value,LYD_ANYDATA_VALUETYPE value_type)

{
  int iVar1;
  lyd_node *node;
  hash_table *phVar2;
  
  node = (lyd_node *)calloc(1,0x40);
  if (node == (lyd_node *)0x0) {
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyd_create_anydata");
    return (lyd_node *)0x0;
  }
  node->schema = schema;
  iVar1 = ly_new_node_validity(schema);
  node->validity = (uint8_t)iVar1;
  iVar1 = resolve_applies_when(schema,0,(lys_node *)0x0);
  if (iVar1 != 0) {
    node->field_0x9 = node->field_0x9 & 0xf1 | 8;
  }
  node->prev = node;
  switch(value_type) {
  case LYD_ANYDATA_CONSTSTRING:
  case LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML:
    phVar2 = (hash_table *)lydict_insert(schema->module->ctx,(char *)value,0);
    node->ht = phVar2;
    break;
  case LYD_ANYDATA_STRING:
  case LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_SXMLD:
    phVar2 = (hash_table *)lydict_insert_zc(schema->module->ctx,(char *)value);
    node->ht = phVar2;
    value_type = value_type & ~LYD_ANYDATA_STRING;
    break;
  case LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_XML|LYD_ANYDATA_STRING:
  case LYD_ANYDATA_XML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_XML|LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXMLD:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
    break;
  case LYD_ANYDATA_XML:
    node->ht = (hash_table *)value;
    value_type = LYD_ANYDATA_XML;
    break;
  case LYD_ANYDATA_DATATREE:
    node->ht = (hash_table *)value;
    value_type = LYD_ANYDATA_DATATREE;
    break;
  default:
    if (value_type != LYD_ANYDATA_LYB) {
      if (value_type == LYD_ANYDATA_LYBD) {
        node->ht = (hash_table *)value;
        goto LAB_00167e26;
      }
      break;
    }
    iVar1 = lyd_lyb_data_length((char *)value);
    if (iVar1 == -1) {
      ly_log(schema->module->ctx,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
      return (lyd_node *)0x0;
    }
    phVar2 = (hash_table *)malloc((long)iVar1);
    node->ht = phVar2;
    if (phVar2 != (hash_table *)0x0) {
      memcpy(phVar2,value,(long)iVar1);
LAB_00167e26:
      value_type = LYD_ANYDATA_LYB;
      break;
    }
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyd_create_anydata");
    free(node);
    goto LAB_00167e59;
  }
  *(LYD_ANYDATA_VALUETYPE *)&node->field_0x34 = value_type;
  lyd_hash(node);
  if (parent != (lyd_node *)0x0) {
    iVar1 = lyd_insert(parent,node);
    if (iVar1 == 0) {
      do {
        if ((parent->field_0x9 & 1) == 0) {
          return node;
        }
        parent->field_0x9 = parent->field_0x9 & 0xfe;
        parent = parent->parent;
      } while (parent != (lyd_node *)0x0);
    }
    else {
      lyd_free_internal_r(node,1);
LAB_00167e59:
      node = (lyd_node *)0x0;
    }
  }
  return node;
}

Assistant:

static struct lyd_node *
lyd_create_anydata(struct lyd_node *parent, const struct lys_node *schema, void *value,
                   LYD_ANYDATA_VALUETYPE value_type)
{
    struct lyd_node *iter;
    struct lyd_node_anydata *ret;
    int len;

    ret = calloc(1, sizeof *ret);
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(schema->module->ctx), NULL);

    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = (struct lyd_node *)ret;

    /* set the value */
    switch (value_type) {
    case LYD_ANYDATA_CONSTSTRING:
    case LYD_ANYDATA_SXML:
    case LYD_ANYDATA_JSON:
        ret->value.str = lydict_insert(schema->module->ctx, (const char *)value, 0);
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_SXMLD:
    case LYD_ANYDATA_JSOND:
        ret->value.str = lydict_insert_zc(schema->module->ctx, (char *)value);
        value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
        break;
    case LYD_ANYDATA_DATATREE:
        ret->value.tree = (struct lyd_node *)value;
        break;
    case LYD_ANYDATA_XML:
        ret->value.xml = (struct lyxml_elem *)value;
        break;
    case LYD_ANYDATA_LYB:
        len = lyd_lyb_data_length(value);
        if (len == -1) {
            LOGERR(schema->module->ctx, LY_EINVAL, "Invalid LYB data.");
            return NULL;
        }
        ret->value.mem = malloc(len);
        LY_CHECK_ERR_RETURN(!ret->value.mem, LOGMEM(schema->module->ctx); free(ret), NULL);
        memcpy(ret->value.mem, value, len);
        break;
    case LYD_ANYDATA_LYBD:
        ret->value.mem = value;
        value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
        break;
    }
    ret->value_type = value_type;

#ifdef LY_ENABLED_CACHE
    lyd_hash((struct lyd_node *)ret);
#endif

    /* connect to parent */
    if (parent) {
        if (lyd_insert(parent, (struct lyd_node*)ret)) {
            lyd_free((struct lyd_node*)ret);
            return NULL;
        }

        /* remove the flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    return (struct lyd_node*)ret;
}